

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * Js::ByteCodeBufferReader::ReadInt16(byte *buffer,size_t remainingBytes,int16 *value)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  char16_t *form;
  long lVar7;
  
  if (remainingBytes == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x130,"(remainingBytes >= sizeof(byte))",
                                "remainingBytes >= sizeof(byte)");
    if (!bVar5) goto LAB_00894d2f;
    *puVar6 = 0;
  }
  bVar1 = *buffer;
  if (bVar1 < 0xfe) {
    *value = (ushort)bVar1;
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,VariableIntEncodingPhase);
    lVar7 = 1;
    if (!bVar5) goto LAB_00894d1a;
    form = L"TestTrace: VariableIntEncoding (decode) - 1 byte, value %u\n";
  }
  else {
    if (remainingBytes < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x135,"(remainingBytes >= sizeof(uint16))",
                                  "remainingBytes >= sizeof(uint16)");
      if (!bVar5) goto LAB_00894d2f;
      *puVar6 = 0;
    }
    if (bVar1 == 0xfe) {
      uVar2 = *(ushort *)(buffer + 1);
      if (uVar2 < 0xfe) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x13b,"(twoByteValue > ((byte) 0xfd))",
                                    "twoByteValue > ONE_BYTE_MAX");
        if (!bVar5) {
LAB_00894d2f:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      *value = uVar2;
      bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,VariableIntEncodingPhase);
      lVar7 = 3;
      if (!bVar5) goto LAB_00894d1a;
      form = L"TestTrace: VariableIntEncoding (decode)- 2 bytes, value %u\n";
    }
    else {
      if (remainingBytes < 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x143,"(remainingBytes >= sizeof(T))",
                                    "remainingBytes >= sizeof(T)");
        if (!bVar5) goto LAB_00894d2f;
        *puVar6 = 0;
      }
      sVar3 = *(short *)(buffer + 1);
      *value = sVar3;
      if (0 < sVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x146,"(*value > ((uint16) 0xffff) || *value <= 0)",
                                    "*value > TWO_BYTE_MAX || *value <= 0");
        if (!bVar5) goto LAB_00894d2f;
        *puVar6 = 0;
      }
      bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,VariableIntEncodingPhase);
      lVar7 = 3;
      if (!bVar5) goto LAB_00894d1a;
      form = L"TestTrace: VariableIntEncoding (decode) - 4 bytes, value %u\n";
    }
  }
  Output::Print(form,(ulong)(uint)(int)*value);
  Output::Flush();
LAB_00894d1a:
  return buffer + lVar7;
}

Assistant:

static const byte * ReadInt16(const byte * buffer, size_t remainingBytes, int16 * value)
    {
#if VARIABLE_INT_ENCODING
        return ReadVariableInt<int16>(buffer, remainingBytes, value);
#else
        Assert(remainingBytes>=sizeof(int16));
        *value = *(int16 *) buffer;
        return buffer + sizeof(int16);
#endif
    }